

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixClose(sqlite3_file *id)

{
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  unixInodeInfo *puVar5;
  unixInodeInfo *puVar6;
  unixInodeInfo **ppuVar7;
  
  psVar2 = id[2].pMethods;
  verifyDbFile((unixFile *)id);
  unixUnlock(id,0);
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
  }
  if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xRead);
  }
  if (*(int *)((long)&psVar2->xWrite + 4) != 0) {
    psVar3 = id[2].pMethods;
    psVar4 = id[6].pMethods;
    psVar4->xClose = (_func_int_sqlite3_file_ptr *)psVar3->xSync;
    psVar3->xSync = (_func_int_sqlite3_file_ptr_int *)psVar4;
    *(undefined4 *)&id[3].pMethods = 0xffffffff;
    id[6].pMethods = (sqlite3_io_methods *)0x0;
  }
  if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar2->xRead);
  }
  psVar2 = id[2].pMethods;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    pp_Var1 = &psVar2->xFileSize;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xRead);
      }
      closePendingFds((unixFile *)id);
      if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar2->xRead);
      }
      puVar5 = (unixInodeInfo *)psVar2->xUnlock;
      puVar6 = (unixInodeInfo *)psVar2->xCheckReservedLock;
      ppuVar7 = &inodeList;
      if (puVar6 != (unixInodeInfo *)0x0) {
        ppuVar7 = &puVar6->pNext;
      }
      *ppuVar7 = puVar5;
      if (puVar5 != (unixInodeInfo *)0x0) {
        puVar5->pPrev = puVar6;
      }
      if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)((sqlite3_mutex *)psVar2->xRead);
      }
      sqlite3_free(psVar2);
    }
  }
  closeUnixFile(id);
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
  }
  return 0;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  unixInodeInfo *pInode = pFile->pInode;

  assert( pInode!=0 );
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  assert( unixFileMutexNotheld(pFile) );
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  sqlite3_mutex_enter(pInode->pLockMutex);
  if( pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  sqlite3_mutex_leave(pInode->pLockMutex);
  releaseInodeInfo(pFile);
  assert( pFile->pShm==0 );
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}